

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_session.c
# Opt level: O1

char * get_first_line(int state)

{
  char *pcVar1;
  size_t sVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  char h [32];
  char acStack_70 [64];
  char local_28 [13];
  undefined1 auStack_1b [2];
  char cStack_19;
  undefined8 local_18;
  char acStack_10 [5];
  undefined1 auStack_b [2];
  undefined1 uStack_9;
  undefined8 uStack_8;
  
  local_18 = 0;
  _acStack_10 = 0;
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  stack0xffffffffffffffe0 = 0;
  if (state < 400) {
    if (state < 300) {
      switch(state) {
      case 200:
        sVar2 = strlen(local_28);
        builtin_strncpy(local_28 + sVar2,"HTTP/1.1 200 OK\r",0x10);
        *(undefined2 *)((long)&local_18 + sVar2) = 10;
        return local_28;
      case 0xc9:
        sVar2 = strlen(local_28);
        builtin_strncpy(&cStack_19 + sVar2,"eated\r\n",8);
        uVar19._0_1_ = ' ';
        uVar19._1_1_ = '2';
        uVar19._2_1_ = '0';
        uVar19._3_1_ = '1';
        uVar27._0_1_ = ' ';
        uVar27._1_1_ = 'C';
        uVar27._2_1_ = 'r';
        uVar27._3_1_ = 'e';
        break;
      case 0xca:
        sVar2 = strlen(local_28);
        *(undefined8 *)((long)&local_18 + sVar2) = 0xa0d6465747065;
        uVar19._0_1_ = ' ';
        uVar19._1_1_ = '2';
        uVar19._2_1_ = '0';
        uVar19._3_1_ = '2';
        uVar27._0_1_ = ' ';
        uVar27._1_1_ = 'A';
        uVar27._2_1_ = 'c';
        uVar27._3_1_ = 'c';
        break;
      case 0xcb:
        sVar2 = strlen(local_28);
        builtin_strncpy(local_28 + sVar2,"HTTP/1.1 203 Non",0x10);
        builtin_strncpy((char *)((long)&local_18 + sVar2),"-authori",8);
        builtin_strncpy(acStack_10 + sVar2,"tative I",8);
        builtin_strncpy(auStack_b + sVar2 + 1," Informa",8);
        builtin_strncpy((char *)((long)&uStack_8 + sVar2 + 6),"tion\\r\n",8);
        return local_28;
      case 0xcc:
        sVar2 = strlen(local_28);
        builtin_strncpy(local_28 + sVar2,"HTTP/1.1 204 No Co",0x12);
        builtin_strncpy((char *)((long)&local_18 + sVar2 + 2),"ntent\r\n",8);
        return local_28;
      case 0xcd:
        sVar2 = strlen(local_28);
        builtin_strncpy(local_28 + sVar2,"HTTP/1.1 205 Res",0x10);
        uVar5._0_1_ = 'R';
        uVar5._1_1_ = 'e';
        uVar5._2_1_ = 's';
        uVar5._3_1_ = 'e';
        uVar12._0_1_ = 't';
        uVar12._1_1_ = ' ';
        uVar12._2_1_ = 'C';
        uVar12._3_1_ = 'o';
        uVar20._0_1_ = 'n';
        uVar20._1_1_ = 't';
        uVar20._2_1_ = 'e';
        uVar20._3_1_ = 'n';
        uVar28._0_1_ = 't';
        uVar28._1_1_ = '\r';
        uVar28._2_1_ = '\n';
        uVar28._3_1_ = '\0';
        goto LAB_00104321;
      case 0xce:
        sVar2 = strlen(local_28);
        builtin_strncpy(local_28 + sVar2,"HTTP/1.1 206 Par",0x10);
        uVar7._0_1_ = 'r';
        uVar7._1_1_ = 't';
        uVar7._2_1_ = 'i';
        uVar7._3_1_ = 'a';
        uVar14._0_1_ = 'l';
        uVar14._1_1_ = ' ';
        uVar14._2_1_ = 'C';
        uVar14._3_1_ = 'o';
        uVar22._0_1_ = 'n';
        uVar22._1_1_ = 't';
        uVar22._2_1_ = 'e';
        uVar22._3_1_ = 'n';
        uVar29._0_1_ = 't';
        uVar29._1_1_ = '\r';
        uVar29._2_1_ = '\n';
        uVar29._3_1_ = '\0';
        goto LAB_00104369;
      default:
        if (state != 100) {
          if (state == 0x65) {
            sVar2 = strlen(local_28);
            builtin_strncpy(local_28 + sVar2,"HTTP/1.1 101 Swi",0x10);
            builtin_strncpy((char *)((long)&local_18 + sVar2),"tching P",8);
            builtin_strncpy(acStack_10 + sVar2,"rotocols",8);
            *(undefined4 *)(&uStack_9 + sVar2) = 0xa0d73;
            return local_28;
          }
          goto switchD_00103ee2_default;
        }
        sVar2 = strlen(local_28);
        *(undefined8 *)((long)&local_18 + sVar2) = 0xa0d65756e6974;
        uVar19._0_1_ = ' ';
        uVar19._1_1_ = '1';
        uVar19._2_1_ = '0';
        uVar19._3_1_ = '0';
        uVar27._0_1_ = ' ';
        uVar27._1_1_ = 'C';
        uVar27._2_1_ = 'o';
        uVar27._3_1_ = 'n';
      }
      goto LAB_001042af;
    }
    switch(state) {
    case 300:
      sVar2 = strlen(local_28);
      builtin_strncpy(local_28 + sVar2,"HTTP/1.1 300 Mul",0x10);
      uVar9._0_1_ = 't';
      uVar9._1_1_ = 'i';
      uVar9._2_1_ = 'p';
      uVar9._3_1_ = 'l';
      uVar16._0_1_ = 'e';
      uVar16._1_1_ = ' ';
      uVar16._2_1_ = 'C';
      uVar16._3_1_ = 'h';
      uVar24._0_1_ = 'o';
      uVar24._1_1_ = 'i';
      uVar24._2_1_ = 'c';
      uVar24._3_1_ = 'e';
      uVar31._0_1_ = 's';
      uVar31._1_1_ = '\r';
      uVar31._2_1_ = '\n';
      uVar31._3_1_ = '\0';
      goto LAB_0010446b;
    case 0x12d:
      sVar2 = strlen(local_28);
      builtin_strncpy(local_28 + sVar2,"HTTP/1.1 301 Mov",0x10);
      builtin_strncpy((char *)((long)&local_18 + sVar2),"ed Perma",8);
      builtin_strncpy(acStack_10 + sVar2,"nently\r\n",8);
      *(undefined1 *)((long)&uStack_8 + sVar2) = 0;
      return local_28;
    case 0x12e:
      sVar2 = strlen(local_28);
      *(undefined8 *)(auStack_1b + sVar2) = 0xa0d646e756f46;
      uVar19._0_1_ = ' ';
      uVar19._1_1_ = '3';
      uVar19._2_1_ = '0';
      uVar19._3_1_ = '2';
      uVar27._0_1_ = ' ';
      uVar27._1_1_ = 'F';
      uVar27._2_1_ = 'o';
      uVar27._3_1_ = 'u';
      goto LAB_001042af;
    case 0x12f:
      sVar2 = strlen(local_28);
      builtin_strncpy(local_28 + sVar2,"HTTP/1.1 303 See",0x10);
      uVar4._0_1_ = '3';
      uVar4._1_1_ = '0';
      uVar4._2_1_ = '3';
      uVar4._3_1_ = ' ';
      uVar11._0_1_ = 'S';
      uVar11._1_1_ = 'e';
      uVar11._2_1_ = 'e';
      uVar11._3_1_ = ' ';
      uVar18._0_1_ = 'O';
      uVar18._1_1_ = 't';
      uVar18._2_1_ = 'h';
      uVar18._3_1_ = 'e';
      uVar26._0_1_ = 'r';
      uVar26._1_1_ = '\r';
      uVar26._2_1_ = '\n';
      uVar26._3_1_ = '\0';
      break;
    case 0x130:
      sVar2 = strlen(local_28);
      builtin_strncpy(local_28 + sVar2,"HTTP/1.1 304 Not",0x10);
      uVar6._0_1_ = ' ';
      uVar6._1_1_ = 'N';
      uVar6._2_1_ = 'o';
      uVar6._3_1_ = 't';
      uVar13._0_1_ = ' ';
      uVar13._1_1_ = 'M';
      uVar13._2_1_ = 'O';
      uVar13._3_1_ = 'd';
      uVar21._0_1_ = 'i';
      uVar21._1_1_ = 'f';
      uVar21._2_1_ = 'i';
      uVar21._3_1_ = 'e';
      goto LAB_00104345;
    case 0x131:
      sVar2 = strlen(local_28);
      builtin_strncpy(local_28 + sVar2,"HTTP/1.1 305 Use",0x10);
      uVar4._0_1_ = '3';
      uVar4._1_1_ = '0';
      uVar4._2_1_ = '5';
      uVar4._3_1_ = ' ';
      uVar11._0_1_ = 'U';
      uVar11._1_1_ = 's';
      uVar11._2_1_ = 'e';
      uVar11._3_1_ = ' ';
      uVar18._0_1_ = 'P';
      uVar18._1_1_ = 'r';
      uVar18._2_1_ = 'o';
      uVar18._3_1_ = 'x';
      uVar26._0_1_ = 'y';
      uVar26._1_1_ = '\r';
      uVar26._2_1_ = '\n';
      uVar26._3_1_ = '\0';
      break;
    case 0x132:
      sVar2 = strlen(local_28);
      *(undefined8 *)(auStack_1b + sVar2 + 1) = 0xa0d646573756e;
      uVar19._0_1_ = ' ';
      uVar19._1_1_ = '3';
      uVar19._2_1_ = '0';
      uVar19._3_1_ = '6';
      uVar27._0_1_ = ' ';
      uVar27._1_1_ = 'U';
      uVar27._2_1_ = 'n';
      uVar27._3_1_ = 'u';
LAB_001042af:
      pcVar1 = local_28 + sVar2;
      pcVar1[0] = 'H';
      pcVar1[1] = 'T';
      pcVar1[2] = 'T';
      pcVar1[3] = 'P';
      pcVar1 = local_28 + sVar2 + 4;
      pcVar1[0] = '/';
      pcVar1[1] = '1';
      pcVar1[2] = '.';
      pcVar1[3] = '1';
      *(undefined4 *)(local_28 + sVar2 + 8) = uVar19;
      *(undefined4 *)(local_28 + sVar2 + 0xc) = uVar27;
      return local_28;
    case 0x133:
      sVar2 = strlen(local_28);
      builtin_strncpy(local_28 + sVar2,"HTTP/1.1 307 Tem",0x10);
      uVar4._0_1_ = '3';
      uVar4._1_1_ = '0';
      uVar4._2_1_ = '7';
      uVar4._3_1_ = ' ';
      uVar11._0_1_ = 'T';
      uVar11._1_1_ = 'e';
      uVar11._2_1_ = 'm';
      uVar11._3_1_ = 'p';
      uVar18._0_1_ = 'o';
      uVar18._1_1_ = 'r';
      uVar18._2_1_ = 'a';
      uVar18._3_1_ = 'r';
      uVar26._0_1_ = 'y';
      uVar26._1_1_ = '\r';
      uVar26._2_1_ = '\n';
      uVar26._3_1_ = '\0';
      break;
    default:
switchD_00103ee2_default:
      get_first_line_cold_1();
      acStack_70[8] = '\0';
      acStack_70[9] = '\0';
      acStack_70[10] = '\0';
      acStack_70[0xb] = '\0';
      acStack_70[0xc] = '\0';
      acStack_70[0xd] = '\0';
      acStack_70[0xe] = '\0';
      acStack_70[0xf] = '\0';
      acStack_70[0x30] = '\0';
      acStack_70[0x31] = '\0';
      acStack_70[0x32] = '\0';
      acStack_70[0x33] = '\0';
      acStack_70[0x34] = '\0';
      acStack_70[0x35] = '\0';
      acStack_70[0x36] = '\0';
      acStack_70[0x37] = '\0';
      acStack_70[0x38] = '\0';
      acStack_70[0x39] = '\0';
      acStack_70[0x3a] = '\0';
      acStack_70[0x3b] = '\0';
      acStack_70[0x3c] = '\0';
      acStack_70[0x3d] = '\0';
      acStack_70[0x3e] = '\0';
      acStack_70[0x3f] = '\0';
      acStack_70[0x20] = '\0';
      acStack_70[0x21] = '\0';
      acStack_70[0x22] = '\0';
      acStack_70[0x23] = '\0';
      acStack_70[0x24] = '\0';
      acStack_70[0x25] = '\0';
      acStack_70[0x26] = '\0';
      acStack_70[0x27] = '\0';
      acStack_70[0x28] = '\0';
      acStack_70[0x29] = '\0';
      acStack_70[0x2a] = '\0';
      acStack_70[0x2b] = '\0';
      acStack_70[0x2c] = '\0';
      acStack_70[0x2d] = '\0';
      acStack_70[0x2e] = '\0';
      acStack_70[0x2f] = '\0';
      acStack_70[0x10] = '\0';
      acStack_70[0x11] = '\0';
      acStack_70[0x12] = '\0';
      acStack_70[0x13] = '\0';
      acStack_70[0x14] = '\0';
      acStack_70[0x15] = '\0';
      acStack_70[0x16] = '\0';
      acStack_70[0x17] = '\0';
      acStack_70[0x18] = '\0';
      acStack_70[0x19] = '\0';
      acStack_70[0x1a] = '\0';
      acStack_70[0x1b] = '\0';
      acStack_70[0x1c] = '\0';
      acStack_70[0x1d] = '\0';
      acStack_70[0x1e] = '\0';
      acStack_70[0x1f] = '\0';
      builtin_strncpy(acStack_70,"Date:",6);
      acStack_70[6] = '\0';
      acStack_70[7] = '\0';
      pcVar1 = get_current_time();
      strcat(acStack_70,pcVar1);
      sVar2 = strlen(acStack_70);
      builtin_strncpy(acStack_70 + sVar2," GMT\r\n",7);
      return acStack_70;
    }
    goto LAB_00104287;
  }
  switch(state) {
  case 400:
    sVar2 = strlen(local_28);
    builtin_strncpy(local_28 + sVar2,"HTTP/1.1 400 Bad",0x10);
    uVar3._0_1_ = '0';
    uVar3._1_1_ = ' ';
    uVar3._2_1_ = 'B';
    uVar3._3_1_ = 'a';
    uVar10._0_1_ = 'd';
    uVar10._1_1_ = ' ';
    uVar10._2_1_ = 'R';
    uVar10._3_1_ = 'e';
    uVar17._0_1_ = 'q';
    uVar17._1_1_ = 'u';
    uVar17._2_1_ = 'e';
    uVar17._3_1_ = 's';
    uVar25._0_1_ = 't';
    uVar25._1_1_ = '\r';
    uVar25._2_1_ = '\n';
    uVar25._3_1_ = '\0';
LAB_001041ab:
    *(undefined4 *)(local_28 + sVar2 + 0xb) = uVar3;
    *(undefined4 *)(&cStack_19 + sVar2) = uVar10;
    *(undefined4 *)((long)&local_18 + sVar2 + 3) = uVar17;
    *(undefined4 *)((long)&local_18 + sVar2 + 7) = uVar25;
    break;
  case 0x191:
    sVar2 = strlen(local_28);
    builtin_strncpy(local_28 + sVar2,"HTTP/1.1 401 Una",0x10);
    uVar6._0_1_ = ' ';
    uVar6._1_1_ = 'U';
    uVar6._2_1_ = 'n';
    uVar6._3_1_ = 'a';
    uVar13._0_1_ = 'u';
    uVar13._1_1_ = 't';
    uVar13._2_1_ = 'h';
    uVar13._3_1_ = 'o';
    uVar21._0_1_ = 'r';
    uVar21._1_1_ = 'i';
    uVar21._2_1_ = 'z';
    uVar21._3_1_ = 'e';
LAB_00104345:
    *(undefined4 *)(local_28 + sVar2 + 0xc) = uVar6;
    *(undefined4 *)((long)&local_18 + sVar2) = uVar13;
    *(undefined4 *)((long)&local_18 + sVar2 + 4) = uVar21;
    builtin_strncpy(acStack_10 + sVar2,"d\r\n",4);
    break;
  case 0x192:
    sVar2 = strlen(local_28);
    builtin_strncpy(local_28 + sVar2,"HTTP/1.1 402 Pay",0x10);
    uVar9._0_1_ = 'm';
    uVar9._1_1_ = 'e';
    uVar9._2_1_ = 'n';
    uVar9._3_1_ = 't';
    uVar16._0_1_ = ' ';
    uVar16._1_1_ = 'R';
    uVar16._2_1_ = 'e';
    uVar16._3_1_ = 'q';
    uVar24._0_1_ = 'u';
    uVar24._1_1_ = 'i';
    uVar24._2_1_ = 'r';
    uVar24._3_1_ = 'e';
    uVar31._0_1_ = 'd';
    uVar31._1_1_ = '\r';
    uVar31._2_1_ = '\n';
    uVar31._3_1_ = '\0';
    goto LAB_0010446b;
  case 0x193:
    sVar2 = strlen(local_28);
    builtin_strncpy(local_28 + sVar2,"HTTP/1.1 403 For",0x10);
    uVar4._0_1_ = '4';
    uVar4._1_1_ = '0';
    uVar4._2_1_ = '3';
    uVar4._3_1_ = ' ';
    uVar11._0_1_ = 'F';
    uVar11._1_1_ = 'o';
    uVar11._2_1_ = 'r';
    uVar11._3_1_ = 'b';
    uVar18._0_1_ = 'i';
    uVar18._1_1_ = 'd';
    uVar18._2_1_ = 'd';
    uVar18._3_1_ = 'e';
    uVar26._0_1_ = 'n';
    uVar26._1_1_ = '\r';
    uVar26._2_1_ = '\n';
    uVar26._3_1_ = '\0';
    goto LAB_00104287;
  case 0x194:
    sVar2 = strlen(local_28);
    builtin_strncpy(local_28 + sVar2,"HTTP/1.1 404 Not",0x10);
    uVar4._0_1_ = '4';
    uVar4._1_1_ = '0';
    uVar4._2_1_ = '4';
    uVar4._3_1_ = ' ';
    uVar11._0_1_ = 'N';
    uVar11._1_1_ = 'o';
    uVar11._2_1_ = 't';
    uVar11._3_1_ = ' ';
    uVar18._0_1_ = 'F';
    uVar18._1_1_ = 'o';
    uVar18._2_1_ = 'u';
    uVar18._3_1_ = 'n';
    uVar26._0_1_ = 'd';
    uVar26._1_1_ = '\r';
    uVar26._2_1_ = '\n';
    uVar26._3_1_ = '\0';
    goto LAB_00104287;
  case 0x195:
    sVar2 = strlen(local_28);
    builtin_strncpy(local_28 + sVar2,"HTTP/1.1 405 Meh",0x10);
    uVar8._0_1_ = 't';
    uVar8._1_1_ = 'o';
    uVar8._2_1_ = 'd';
    uVar8._3_1_ = ' ';
    uVar15._0_1_ = 'N';
    uVar15._1_1_ = 'o';
    uVar15._2_1_ = 't';
    uVar15._3_1_ = ' ';
    uVar23._0_1_ = 'A';
    uVar23._1_1_ = 'l';
    uVar23._2_1_ = 'l';
    uVar23._3_1_ = 'o';
    uVar30._0_1_ = 'w';
    uVar30._1_1_ = 'e';
    uVar30._2_1_ = 'd';
    uVar30._3_1_ = '\r';
    goto LAB_001043d7;
  case 0x196:
    sVar2 = strlen(local_28);
    builtin_strncpy(local_28 + sVar2,"HTTP/1.1 406 Not",0x10);
    builtin_strncpy(auStack_1b + sVar2 + 1,"ot Accep",8);
    builtin_strncpy((char *)((long)&local_18 + sVar2 + 6),"table\r\n",8);
    break;
  case 0x197:
    sVar2 = strlen(local_28);
    builtin_strncpy(local_28 + sVar2,"HTTP/1.1 407 Pro",0x10);
    builtin_strncpy((char *)((long)&local_18 + sVar2),"xy Authe",8);
    builtin_strncpy(acStack_10 + sVar2,"nticatio",8);
    builtin_strncpy(auStack_b + sVar2,"tion Req",8);
    builtin_strncpy((char *)((long)&uStack_8 + sVar2 + 5),"uired\r\n",8);
    break;
  case 0x198:
    sVar2 = strlen(local_28);
    builtin_strncpy(local_28 + sVar2,"HTTP/1.1 408 Req",0x10);
    uVar9._0_1_ = 'u';
    uVar9._1_1_ = 'u';
    uVar9._2_1_ = 'e';
    uVar9._3_1_ = 's';
    uVar16._0_1_ = 't';
    uVar16._1_1_ = ' ';
    uVar16._2_1_ = 'T';
    uVar16._3_1_ = 'i';
    uVar24._0_1_ = 'm';
    uVar24._1_1_ = 'e';
    uVar24._2_1_ = 'o';
    uVar24._3_1_ = 'u';
    uVar31._0_1_ = 't';
    uVar31._1_1_ = '\r';
    uVar31._2_1_ = '\n';
    uVar31._3_1_ = '\0';
    goto LAB_0010446b;
  case 0x199:
    sVar2 = strlen(local_28);
    builtin_strncpy(local_28 + sVar2,"HTTP/1.1 409 Con",0x10);
    uVar4._0_1_ = '4';
    uVar4._1_1_ = '0';
    uVar4._2_1_ = '9';
    uVar4._3_1_ = ' ';
    uVar11._0_1_ = 'C';
    uVar11._1_1_ = 'o';
    uVar11._2_1_ = 'n';
    uVar11._3_1_ = 'f';
    uVar18._0_1_ = 'l';
    uVar18._1_1_ = 'i';
    uVar18._2_1_ = 'c';
    uVar18._3_1_ = 't';
    uVar26._0_1_ = '\r';
    uVar26._1_1_ = '\\';
    uVar26._2_1_ = 'n';
    uVar26._3_1_ = '\0';
LAB_00104287:
    *(undefined4 *)(local_28 + sVar2 + 9) = uVar4;
    *(undefined4 *)(auStack_1b + sVar2) = uVar11;
    *(undefined4 *)((long)&local_18 + sVar2 + 1) = uVar18;
    *(undefined4 *)((long)&local_18 + sVar2 + 5) = uVar26;
    break;
  case 0x19a:
    sVar2 = strlen(local_28);
    builtin_strncpy(local_28 + sVar2,"HTTP/1.1 410 Gon",0x10);
    *(undefined4 *)((long)&local_18 + sVar2) = 0xa0d65;
    break;
  case 0x19b:
    sVar2 = strlen(local_28);
    builtin_strncpy(local_28 + sVar2,"HTTP/1.1 411 Len",0x10);
    uVar5._0_1_ = 'L';
    uVar5._1_1_ = 'e';
    uVar5._2_1_ = 'n';
    uVar5._3_1_ = 't';
    uVar12._0_1_ = 'h';
    uVar12._1_1_ = ' ';
    uVar12._2_1_ = 'R';
    uVar12._3_1_ = 'e';
    uVar20._0_1_ = 'q';
    uVar20._1_1_ = 'u';
    uVar20._2_1_ = 'i';
    uVar20._3_1_ = 'r';
    uVar28._0_1_ = 'e';
    uVar28._1_1_ = '\r';
    uVar28._2_1_ = '\n';
    uVar28._3_1_ = '\0';
LAB_00104321:
    *(undefined4 *)(auStack_1b + sVar2) = uVar5;
    *(undefined4 *)((long)&local_18 + sVar2 + 1) = uVar12;
    *(undefined4 *)((long)&local_18 + sVar2 + 5) = uVar20;
    *(undefined4 *)(acStack_10 + sVar2 + 1) = uVar28;
    break;
  case 0x19c:
    sVar2 = strlen(local_28);
    builtin_strncpy(local_28 + sVar2,"HTTP/1.1 412 Pre",0x10);
    builtin_strncpy((char *)((long)&local_18 + sVar2),"conditio",8);
    builtin_strncpy(acStack_10 + sVar2,"n Failed",8);
    *(undefined4 *)(&uStack_9 + sVar2) = 0xa0d64;
    break;
  case 0x19d:
    sVar2 = strlen(local_28);
    *(undefined8 *)((long)&uStack_8 + sVar2) = 0xa0d656772614c;
    builtin_strncpy(local_28 + sVar2,"HTTP/1.1 413 Req",0x10);
    uVar9._0_1_ = 'u';
    uVar9._1_1_ = 'e';
    uVar9._2_1_ = 's';
    uVar9._3_1_ = 't';
    uVar16._0_1_ = ' ';
    uVar16._1_1_ = 'E';
    uVar16._2_1_ = 'n';
    uVar16._3_1_ = 't';
    uVar24._0_1_ = 'i';
    uVar24._1_1_ = 't';
    uVar24._2_1_ = 'y';
    uVar24._3_1_ = ' ';
    uVar31._0_1_ = 'T';
    uVar31._1_1_ = 'o';
    uVar31._2_1_ = 'o';
    uVar31._3_1_ = ' ';
    goto LAB_0010446b;
  case 0x19e:
    sVar2 = strlen(local_28);
    builtin_strncpy(local_28 + sVar2,"HTTP/1.1 414 Req",0x10);
    builtin_strncpy((char *)((long)&local_18 + sVar2),"uest-url",8);
    builtin_strncpy(acStack_10 + sVar2," Too Lon",8);
    *(undefined4 *)((long)&uStack_8 + sVar2) = 0xa0d67;
    break;
  case 0x19f:
    sVar2 = strlen(local_28);
    *(undefined8 *)(auStack_b + sVar2 + 1) = 0xa0d6570795420;
    builtin_strncpy(local_28 + sVar2,"HTTP/1.1 415 Uns",0x10);
    uVar9._0_1_ = 'u';
    uVar9._1_1_ = 'p';
    uVar9._2_1_ = 'p';
    uVar9._3_1_ = 'o';
    uVar16._0_1_ = 'r';
    uVar16._1_1_ = 't';
    uVar16._2_1_ = 'e';
    uVar16._3_1_ = 'd';
    uVar24._0_1_ = ' ';
    uVar24._1_1_ = 'M';
    uVar24._2_1_ = 'e';
    uVar24._3_1_ = 'd';
    uVar31._0_1_ = 'i';
    uVar31._1_1_ = 'a';
    uVar31._2_1_ = ' ';
    uVar31._3_1_ = 'T';
    goto LAB_0010446b;
  case 0x1a0:
    sVar2 = strlen(local_28);
    builtin_strncpy(local_28 + sVar2,"HTTP/1.1 416\r\n",0xf);
    break;
  case 0x1a1:
    sVar2 = strlen(local_28);
    builtin_strncpy(local_28 + sVar2,"HTTP/1.1 417 Exc",0x10);
    uVar8._0_1_ = 'e';
    uVar8._1_1_ = 'p';
    uVar8._2_1_ = 't';
    uVar8._3_1_ = 'a';
    uVar15._0_1_ = 't';
    uVar15._1_1_ = 'i';
    uVar15._2_1_ = 'o';
    uVar15._3_1_ = 'n';
    uVar23._0_1_ = ' ';
    uVar23._1_1_ = 'F';
    uVar23._2_1_ = 'a';
    uVar23._3_1_ = 'i';
    uVar30._0_1_ = 'l';
    uVar30._1_1_ = 'e';
    uVar30._2_1_ = 'd';
    uVar30._3_1_ = '\r';
LAB_001043d7:
    *(undefined4 *)((long)&local_18 + sVar2) = uVar8;
    *(undefined4 *)((long)&local_18 + sVar2 + 4) = uVar15;
    *(undefined4 *)(acStack_10 + sVar2) = uVar23;
    *(undefined4 *)(acStack_10 + sVar2 + 4) = uVar30;
    *(undefined2 *)((long)&uStack_8 + sVar2) = 10;
    break;
  default:
    switch(state) {
    case 500:
      sVar2 = strlen(local_28);
      *(undefined8 *)(auStack_b + sVar2) = 0xa0d726f727245;
      builtin_strncpy(local_28 + sVar2,"HTTP/1.1 500 Int",0x10);
      uVar9._0_1_ = 'e';
      uVar9._1_1_ = 'r';
      uVar9._2_1_ = 'n';
      uVar9._3_1_ = 'a';
      uVar16._0_1_ = 'l';
      uVar16._1_1_ = ' ';
      uVar16._2_1_ = 'S';
      uVar16._3_1_ = 'e';
      uVar24._0_1_ = 'r';
      uVar24._1_1_ = 'v';
      uVar24._2_1_ = 'e';
      uVar24._3_1_ = 'r';
      uVar31._0_1_ = ' ';
      uVar31._1_1_ = 'E';
      uVar31._2_1_ = 'r';
      uVar31._3_1_ = 'r';
      break;
    case 0x1f5:
      sVar2 = strlen(local_28);
      builtin_strncpy(local_28 + sVar2,"HTTP/1.1 501 Not",0x10);
      uVar7._0_1_ = 't';
      uVar7._1_1_ = ' ';
      uVar7._2_1_ = 'I';
      uVar7._3_1_ = 'm';
      uVar14._0_1_ = 'p';
      uVar14._1_1_ = 'l';
      uVar14._2_1_ = 'e';
      uVar14._3_1_ = 'm';
      uVar22._0_1_ = 'e';
      uVar22._1_1_ = 'n';
      uVar22._2_1_ = 't';
      uVar22._3_1_ = 'e';
      uVar29._0_1_ = 'd';
      uVar29._1_1_ = '\r';
      uVar29._2_1_ = '\n';
      uVar29._3_1_ = '\0';
      goto LAB_00104369;
    case 0x1f6:
      sVar2 = strlen(local_28);
      builtin_strncpy(local_28 + sVar2,"HTTP/1.1 502 Bad",0x10);
      uVar3._0_1_ = '2';
      uVar3._1_1_ = ' ';
      uVar3._2_1_ = 'B';
      uVar3._3_1_ = 'a';
      uVar10._0_1_ = 'd';
      uVar10._1_1_ = ' ';
      uVar10._2_1_ = 'G';
      uVar10._3_1_ = 'e';
      uVar17._0_1_ = 't';
      uVar17._1_1_ = 'a';
      uVar17._2_1_ = 'w';
      uVar17._3_1_ = 'a';
      uVar25._0_1_ = 'y';
      uVar25._1_1_ = '\r';
      uVar25._2_1_ = '\n';
      uVar25._3_1_ = '\0';
      goto LAB_001041ab;
    case 0x1f7:
      sVar2 = strlen(local_28);
      builtin_strncpy(local_28 + sVar2,"HTTP/1.1 503 Ser",0x10);
      builtin_strncpy((char *)((long)&local_18 + sVar2),"vice Una",8);
      builtin_strncpy(acStack_10 + sVar2,"vailable",8);
      *(undefined4 *)(&uStack_9 + sVar2) = 0xa0d65;
      return local_28;
    case 0x1f8:
      sVar2 = strlen(local_28);
      builtin_strncpy(local_28 + sVar2,"HTTP/1.1 504 Gat",0x10);
      uVar7._0_1_ = 't';
      uVar7._1_1_ = 'e';
      uVar7._2_1_ = 'w';
      uVar7._3_1_ = 'a';
      uVar14._0_1_ = 'y';
      uVar14._1_1_ = ' ';
      uVar14._2_1_ = 'T';
      uVar14._3_1_ = 'i';
      uVar22._0_1_ = 'm';
      uVar22._1_1_ = 'e';
      uVar22._2_1_ = 'o';
      uVar22._3_1_ = 'u';
      uVar29._0_1_ = 't';
      uVar29._1_1_ = '\r';
      uVar29._2_1_ = '\n';
      uVar29._3_1_ = '\0';
LAB_00104369:
      *(undefined4 *)(&cStack_19 + sVar2) = uVar7;
      *(undefined4 *)((long)&local_18 + sVar2 + 3) = uVar14;
      *(undefined4 *)((long)&local_18 + sVar2 + 7) = uVar22;
      *(undefined4 *)(acStack_10 + sVar2 + 3) = uVar29;
      return local_28;
    case 0x1f9:
      sVar2 = strlen(local_28);
      *(undefined8 *)((long)&uStack_8 + sVar2) = 0xa0d74726f7070;
      builtin_strncpy(local_28 + sVar2,"HTTP/1.1 505 HTT",0x10);
      uVar9._0_1_ = 'P';
      uVar9._1_1_ = ' ';
      uVar9._2_1_ = 'V';
      uVar9._3_1_ = 'e';
      uVar16._0_1_ = 'r';
      uVar16._1_1_ = 's';
      uVar16._2_1_ = 'i';
      uVar16._3_1_ = 'o';
      uVar24._0_1_ = 'n';
      uVar24._1_1_ = ' ';
      uVar24._2_1_ = 'N';
      uVar24._3_1_ = 'o';
      uVar31._0_1_ = 't';
      uVar31._1_1_ = ' ';
      uVar31._2_1_ = 'S';
      uVar31._3_1_ = 'u';
      break;
    default:
      goto switchD_00103ee2_default;
    }
LAB_0010446b:
    *(undefined4 *)((long)&local_18 + sVar2) = uVar9;
    *(undefined4 *)((long)&local_18 + sVar2 + 4) = uVar16;
    *(undefined4 *)(acStack_10 + sVar2) = uVar24;
    *(undefined4 *)(acStack_10 + sVar2 + 4) = uVar31;
  }
  return local_28;
}

Assistant:

char *get_first_line(int state){
    char *head, h[32] = "";
    switch(state){
        case 100: strcat(h, "HTTP/1.1 100 Continue\r\n"); break;
        case 101: strcat(h, "HTTP/1.1 101 Switching Protocols\r\n"); break;
        case 200: strcat(h, "HTTP/1.1 200 OK\r\n");  break;
        case 201: strcat(h, "HTTP/1.1 201 Created\r\n"); break;
        case 202: strcat(h, "HTTP/1.1 202 Accepted\r\n"); break;
        case 203: strcat(h, "HTTP/1.1 203 Non-authoritative Information\\r\n"); break;
        case 204: strcat(h, "HTTP/1.1 204 No Content\r\n"); break;
        case 205: strcat(h, "HTTP/1.1 205 Reset Content\r\n"); break;
        case 206: strcat(h, "HTTP/1.1 206 Partial Content\r\n"); break;
        case 300: strcat(h, "HTTP/1.1 300 Multiple Choices\r\n"); break;
        case 301: strcat(h, "HTTP/1.1 301 Moved Permanently\r\n"); break;
        case 302: strcat(h, "HTTP/1.1 302 Found\r\n"); break;
        case 303: strcat(h, "HTTP/1.1 303 See Other\r\n"); break;
        case 304: strcat(h, "HTTP/1.1 304 Not MOdified\r\n"); break;
        case 305: strcat(h, "HTTP/1.1 305 Use Proxy\r\n"); break;
        case 306: strcat(h, "HTTP/1.1 306 Unused\r\n"); break;
        case 307: strcat(h, "HTTP/1.1 307 Temporary\r\n"); break;
        case 400: strcat(h, "HTTP/1.1 400 Bad Request\r\n"); break;
        case 401: strcat(h, "HTTP/1.1 401 Unauthorized\r\n"); break;
        case 402: strcat(h, "HTTP/1.1 402 Payment Required\r\n"); break;
        case 403: strcat(h, "HTTP/1.1 403 Forbidden\r\n"); break;
        case 404: strcat(h, "HTTP/1.1 404 Not Found\r\n"); break;
        case 405: strcat(h, "HTTP/1.1 405 Mehtod Not Allowed\r\n"); break;
        case 406: strcat(h, "HTTP/1.1 406 Not Acceptable\r\n"); break;
        case 407: strcat(h, "HTTP/1.1 407 Proxy Authentication Required\r\n"); break;
        case 408: strcat(h, "HTTP/1.1 408 Requuest Timeout\r\n"); break;
        case 409: strcat(h, "HTTP/1.1 409 Conflict\r\\n"); break;
        case 410: strcat(h, "HTTP/1.1 410 Gone\r\n"); break;
        case 411: strcat(h, "HTTP/1.1 411 Lenth Require\r\n"); break;
        case 412: strcat(h, "HTTP/1.1 412 Precondition Failed\r\n"); break;
        case 413: strcat(h, "HTTP/1.1 413 Request Entity Too Large\r\n"); break;
        case 414: strcat(h, "HTTP/1.1 414 Request-url Too Long\r\n"); break;
        case 415: strcat(h, "HTTP/1.1 415 Unsupported Media Type\r\n"); break;
        case 416: strcat(h, "HTTP/1.1 416\r\n"); break;
        case 417: strcat(h, "HTTP/1.1 417 Exceptation Failed\r\n"); break;
        case 500: strcat(h, "HTTP/1.1 500 Internal Server Error\r\n"); break;
        case 501: strcat(h, "HTTP/1.1 501 Not Implemented\r\n"); break;
        case 502: strcat(h, "HTTP/1.1 502 Bad Getaway\r\n"); break;
        case 503: strcat(h, "HTTP/1.1 503 Service Unavailable\r\n"); break;
        case 504: strcat(h, "HTTP/1.1 504 Gateway Timeout\r\n"); break;
        case 505: strcat(h, "HTTP/1.1 505 HTTP Version Not Support\r\n"); break;
        default:
            perror("Unknow state code!");
            exit(1);
    }
    head = h;
    return head;
}